

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O0

void belsGenkStart(void *state,octet *s,size_t count,size_t threshold,size_t len)

{
  u32 *X;
  u32 *puVar1;
  octet *key_00;
  u32 in_ECX;
  u32 in_EDX;
  u32 *in_RDI;
  u32 *K;
  octet *iv;
  octet *key;
  
  X = (u32 *)beltCTR_keep();
  puVar1 = (u32 *)beltCompr_deep();
  if (puVar1 < X) {
    key_00 = (octet *)beltCTR_keep();
  }
  else {
    key_00 = (octet *)beltCompr_deep();
  }
  puVar1 = (u32 *)((octet *)((long)in_RDI + (long)key_00) + 0x20);
  beltKeyExpand2(in_RDI,key_00,0x1328fc);
  memCopy(in_RDI,key_00,0x132914);
  memNeg(puVar1,0x20);
  beltCompr(puVar1,X,in_RDI);
  u32To(in_RDI,(size_t)key_00,(u32 *)0x13294b);
  puVar1[4] = in_EDX;
  puVar1[5] = in_ECX;
  u32To(in_RDI,(size_t)key_00,(u32 *)0x132981);
  u32To(in_RDI,(size_t)key_00,(u32 *)0x13299d);
  memSet(in_RDI,(octet)((ulong)key_00 >> 0x38),0x1329b2);
  beltCTRStart(puVar1,(octet *)X,(size_t)in_RDI,key_00);
  return;
}

Assistant:

static void belsGenkStart(void* state, const octet s[], size_t count,
	size_t threshold, size_t len)
{
	octet* key;
	octet* iv;
	u32* K;
	// pre
	ASSERT(memIsValid(state, belsGenk_keep()));
	ASSERT(len == 16 || len == 24 || len == 32);
	ASSERT(memIsValid(s, len));
	// раскладка state
	key = (octet*)state + MAX2(beltCTR_keep(), beltCompr_deep());
	iv = key + 32;
	K = (u32*)iv;
	// K <- belt-keyexpand(s)
	beltKeyExpand2(K, s, len);
	// key <- belt-compress(~K || K)
	memCopy(K + 8, K, 32);
	memNeg(K, 32);
	beltCompr((u32*)key, K, state);
	u32To(key, 32, (u32*)key);
	// iv <- <n>_32 || <t>_32 || 0
	K[4] = (u32)count, K[5] = (u32)threshold;
	u32To(iv, 4, K + 4);
	u32To(iv + 4, 4, K + 5);
	memSetZero(iv + 8, 8);
	// start belt-ctr(key, iv)
	beltCTRStart(state, key, 32, iv);
}